

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O0

lh_table *
lh_table_new(int size,lh_entry_free_fn *free_fn,lh_hash_fn *hash_fn,lh_equal_fn *equal_fn)

{
  lh_entry *plVar1;
  lh_table *t;
  int i;
  lh_equal_fn *equal_fn_local;
  lh_hash_fn *hash_fn_local;
  lh_entry_free_fn *free_fn_local;
  lh_table *plStack_10;
  int size_local;
  
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/linkhash.c",
                  0x1fa,
                  "struct lh_table *lh_table_new(int, lh_entry_free_fn *, lh_hash_fn *, lh_equal_fn *)"
                 );
  }
  plStack_10 = (lh_table *)calloc(1,0x38);
  if (plStack_10 == (lh_table *)0x0) {
    plStack_10 = (lh_table *)0x0;
  }
  else {
    plStack_10->count = 0;
    plStack_10->size = size;
    plVar1 = (lh_entry *)calloc((long)size,0x28);
    plStack_10->table = plVar1;
    if (plStack_10->table == (lh_entry *)0x0) {
      free(plStack_10);
      plStack_10 = (lh_table *)0x0;
    }
    else {
      plStack_10->free_fn = free_fn;
      plStack_10->hash_fn = hash_fn;
      plStack_10->equal_fn = equal_fn;
      for (t._4_4_ = 0; t._4_4_ < size; t._4_4_ = t._4_4_ + 1) {
        plStack_10->table[t._4_4_].k = (void *)0xffffffffffffffff;
      }
    }
  }
  return plStack_10;
}

Assistant:

struct lh_table *lh_table_new(int size, lh_entry_free_fn *free_fn, lh_hash_fn *hash_fn,
                              lh_equal_fn *equal_fn)
{
	int i;
	struct lh_table *t;

	/* Allocate space for elements to avoid divisions by zero. */
	assert(size > 0);
	t = (struct lh_table *)calloc(1, sizeof(struct lh_table));
	if (!t)
		return NULL;

	t->count = 0;
	t->size = size;
	t->table = (struct lh_entry *)calloc(size, sizeof(struct lh_entry));
	if (!t->table)
	{
		free(t);
		return NULL;
	}
	t->free_fn = free_fn;
	t->hash_fn = hash_fn;
	t->equal_fn = equal_fn;
	for (i = 0; i < size; i++)
		t->table[i].k = LH_EMPTY;
	return t;
}